

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

gflags * __thiscall
gflags::TheseCommandlineFlagsIntoString_abi_cxx11_
          (gflags *this,
          vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *flags)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  pointer pCVar4;
  __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
  local_60;
  CommandLineFlagInfo *local_58;
  undefined1 local_39;
  __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
  local_38;
  CommandLineFlagInfo *local_30;
  long local_28;
  size_t retval_space;
  const_iterator i;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *flags_local;
  string *retval;
  
  i._M_current = (CommandLineFlagInfo *)flags;
  __gnu_cxx::
  __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
  ::__normal_iterator((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                       *)&retval_space);
  local_28 = 0;
  local_30 = (CommandLineFlagInfo *)
             std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
             ::begin(i._M_current);
  retval_space = (size_t)local_30;
  while( true ) {
    local_38._M_current =
         (CommandLineFlagInfo *)
         std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::end
                   (i._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                        *)&retval_space,&local_38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
    ::operator->((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                  *)&retval_space);
    lVar2 = std::__cxx11::string::length();
    __gnu_cxx::
    __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
    ::operator->((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                  *)&retval_space);
    lVar3 = std::__cxx11::string::length();
    local_28 = lVar2 + lVar3 + 5 + local_28;
    __gnu_cxx::
    __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
    ::operator++((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                  *)&retval_space);
  }
  local_39 = 0;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::reserve((ulong)this);
  local_58 = (CommandLineFlagInfo *)
             std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
             ::begin(i._M_current);
  retval_space = (size_t)local_58;
  while( true ) {
    local_60._M_current =
         (CommandLineFlagInfo *)
         std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::end
                   (i._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                        *)&retval_space,&local_60);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)this,"--");
    pCVar4 = __gnu_cxx::
             __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
             ::operator->((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                           *)&retval_space);
    std::__cxx11::string::operator+=((string *)this,(string *)pCVar4);
    std::__cxx11::string::operator+=((string *)this,"=");
    pCVar4 = __gnu_cxx::
             __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
             ::operator->((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                           *)&retval_space);
    std::__cxx11::string::operator+=((string *)this,(string *)&pCVar4->current_value);
    std::__cxx11::string::operator+=((string *)this,"\n");
    __gnu_cxx::
    __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
    ::operator++((__normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                  *)&retval_space);
  }
  return this;
}

Assistant:

static string TheseCommandlineFlagsIntoString(
    const vector<CommandLineFlagInfo>& flags) {
  vector<CommandLineFlagInfo>::const_iterator i;

  size_t retval_space = 0;
  for (i = flags.begin(); i != flags.end(); ++i) {
    // An (over)estimate of how much space it will take to print this flag
    retval_space += i->name.length() + i->current_value.length() + 5;
  }

  string retval;
  retval.reserve(retval_space);
  for (i = flags.begin(); i != flags.end(); ++i) {
    retval += "--";
    retval += i->name;
    retval += "=";
    retval += i->current_value;
    retval += "\n";
  }
  return retval;
}